

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O2

int uv_fs_poll_stop(uv_fs_poll_t *handle)

{
  uint *puVar1;
  long *plVar2;
  uint uVar3;
  char *__assertion;
  
  uVar3 = handle->flags;
  if ((uVar3 >> 0xe & 1) == 0) {
    return 0;
  }
  plVar2 = (long *)handle->poll_ctx;
  if (plVar2 == (long *)0x0) {
    __assertion = "ctx != NULL";
    uVar3 = 0x68;
  }
  else {
    if (*plVar2 != 0) {
      *plVar2 = 0;
      handle->poll_ctx = (void *)0x0;
      if ((*(byte *)((long)plVar2 + 0x59) & 0x40) != 0) {
        uv_close((uv_handle_t *)(plVar2 + 5),timer_close_cb);
        uVar3 = handle->flags;
        if ((uVar3 >> 0xe & 1) == 0) {
          return 0;
        }
      }
      handle->flags = uVar3 & 0xffffbfff;
      if ((uVar3 >> 0xd & 1) == 0) {
        return 0;
      }
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 - 1;
      return 0;
    }
    __assertion = "ctx->parent_handle != NULL";
    uVar3 = 0x69;
  }
  __assert_fail(__assertion,"src/fs-poll.c",uVar3,"int uv_fs_poll_stop(uv_fs_poll_t *)");
}

Assistant:

int uv_fs_poll_stop(uv_fs_poll_t* handle) {
  struct poll_ctx* ctx;

  if (!uv__is_active(handle))
    return 0;

  ctx = handle->poll_ctx;
  assert(ctx != NULL);
  assert(ctx->parent_handle != NULL);
  ctx->parent_handle = NULL;
  handle->poll_ctx = NULL;

  /* Close the timer if it's active. If it's inactive, there's a stat request
   * in progress and poll_cb will take care of the cleanup.
   */
  if (uv__is_active(&ctx->timer_handle))
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);

  uv__handle_stop(handle);

  return 0;
}